

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

void __thiscall brotli::Command::Command(Command *this,size_t insertlen)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  this->insert_len_ = (uint32_t)insertlen;
  this->copy_len_ = 0;
  this->dist_extra_ = 0;
  this->dist_prefix_ = 0x10;
  if (insertlen < 6) {
    uVar2 = insertlen & 0xffffffff;
  }
  else if (insertlen < 0x82) {
    uVar1 = 0x1f;
    uVar3 = (uint)(insertlen - 2);
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar2 = (ulong)((int)(insertlen - 2 >> ((char)(uVar1 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                    (uVar1 ^ 0xffffffe0) * 2 + 0x40);
  }
  else if (insertlen < 0x842) {
    uVar3 = (uint32_t)insertlen - 0x42;
    uVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar2 = (ulong)((uVar1 ^ 0xffe0) + 0x2a);
  }
  else {
    uVar2 = 0x15;
    if (0x1841 < insertlen) {
      uVar2 = (ulong)(ushort)(0x17 - (insertlen < 0x5842));
    }
  }
  uVar3 = (int)(uVar2 & 0xffff) * 4;
  uVar1 = *(uint *)(kInsExtra + uVar3);
  uVar3 = *(uint *)(kInsBase + uVar3);
  this->cmd_prefix_ =
       (short)uVar2 * 8 & 0x38U |
       *(ushort *)
        (CombineLengthCodes(unsigned_short,unsigned_short,bool)::cells +
        (ulong)(uint)((int)((uVar2 & 0xffff) >> 3) * 3) * 2) | 2;
  this->cmd_extra_ = (ulong)uVar1 << 0x30 | insertlen - uVar3;
  return;
}

Assistant:

explicit Command(size_t insertlen)
      : insert_len_(static_cast<uint32_t>(insertlen))
      , copy_len_(0), dist_extra_(0), dist_prefix_(16) {
    GetLengthCode(insertlen, 4, dist_prefix_ == 0, &cmd_prefix_, &cmd_extra_);
  }